

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_57d50e7::PKDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,PKDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  uint uVar1;
  pointer pCVar2;
  uint uVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  vector<CScript,_std::allocator<CScript>_> *ret;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  CScript script;
  pointer local_98;
  long local_90;
  long local_88;
  allocator_type local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [28];
  uint uStack_3c;
  direct_or_indirect local_38;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_xonly == true) {
    local_58._16_8_ = 0;
    stack0xffffffffffffffc0 = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    pCVar2 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_78 = *(undefined8 *)(pCVar2->vch + 1);
    uStack_70 = *(undefined8 *)(pCVar2->vch + 9);
    local_68 = *(undefined8 *)(pCVar2->vch + 0x11);
    uStack_60 = *(undefined8 *)(pCVar2->vch + 0x19);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78,
               local_58,&local_79);
    b._M_extent._M_extent_value = local_90 - (long)local_98;
    b._M_ptr = local_98;
    this_00 = &CScript::operator<<((CScript *)local_58,b)->super_CScriptBase;
    uVar1 = this_00->_size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    ppVar4 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this_00->_union).indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      ppVar4 = this_00;
    }
    local_79 = (allocator_type)0xac;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (this_00,(uchar *)((long)&ppVar4->_union + (long)(int)uVar3),(uchar *)&local_79);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_38.indirect_contents,
               this_00);
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    if (0x1c < uStack_3c) {
      free((void *)local_58._0_8_);
      local_58._0_8_ = (char *)0x0;
    }
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_38.indirect_contents);
  }
  else {
    GetScriptForRawPubKey
              ((CScript *)&local_38.indirect_contents,
               (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
               super__Vector_impl_data._M_start);
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_38.indirect_contents);
  }
  if (0x1c < local_1c) {
    free(local_38.indirect_contents.indirect);
    local_38.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override
    {
        if (m_xonly) {
            CScript script = CScript() << ToByteVector(XOnlyPubKey(keys[0])) << OP_CHECKSIG;
            return Vector(std::move(script));
        } else {
            return Vector(GetScriptForRawPubKey(keys[0]));
        }
    }